

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O0

ares_status_t
ares_socket_configure(ares_channel_t *channel,int family,ares_bool_t is_tcp,ares_socket_t fd)

{
  _func_int_ares_socket_t_ares_socket_opt_t_void_ptr_ares_socklen_t_void_ptr *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  undefined4 uVar8;
  int iVar9;
  int *piVar10;
  size_t sVar11;
  char *pcVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  uint local_4c;
  uint bind_flags;
  int rv;
  ares_socklen_t bindlen;
  anon_union_28_3_cd40b0ee local;
  ares_socket_t fd_local;
  ares_bool_t is_tcp_local;
  int family_local;
  ares_channel_t *channel_local;
  
  bind_flags = 0;
  local._20_4_ = fd;
  local.sa6.sin6_scope_id = is_tcp;
  fd_local = family;
  _is_tcp_local = channel;
  if (((channel->socket_send_buffer_size < 1) ||
      (iVar9 = (*(channel->sock_funcs).asetsockopt)
                         (fd,ARES_SOCKET_OPT_SENDBUF_SIZE,&channel->socket_send_buffer_size,4,
                          channel->sock_func_cb_data), iVar9 == 0)) ||
     (piVar10 = __errno_location(), *piVar10 == 0x26)) {
    if (((_is_tcp_local->socket_receive_buffer_size < 1) ||
        (iVar9 = (*(_is_tcp_local->sock_funcs).asetsockopt)
                           (local._20_4_,ARES_SOCKET_OPT_RECVBUF_SIZE,
                            &_is_tcp_local->socket_receive_buffer_size,4,
                            _is_tcp_local->sock_func_cb_data), iVar9 == 0)) ||
       (piVar10 = __errno_location(), *piVar10 == 0x26)) {
      sVar11 = ares_strlen(_is_tcp_local->local_dev_name);
      uVar8 = local._20_4_;
      if (sVar11 != 0) {
        p_Var1 = (_is_tcp_local->sock_funcs).asetsockopt;
        pcVar12 = _is_tcp_local->local_dev_name;
        sVar11 = ares_strlen(_is_tcp_local->local_dev_name);
        (*p_Var1)(uVar8,ARES_SOCKET_OPT_BIND_DEVICE,pcVar12,(ares_socklen_t)sVar11,
                  _is_tcp_local->sock_func_cb_data);
      }
      if ((fd_local == 2) && (_is_tcp_local->local_ip4 != 0)) {
        memset(&rv,0,0x10);
        rv._0_2_ = 2;
        bindlen = htonl(_is_tcp_local->local_ip4);
        bind_flags = 0x10;
      }
      else if (fd_local == 10) {
        cVar13 = -(_is_tcp_local->local_ip6[0] == 0);
        cVar14 = -(_is_tcp_local->local_ip6[1] == 0);
        cVar15 = -(_is_tcp_local->local_ip6[2] == 0);
        cVar16 = -(_is_tcp_local->local_ip6[3] == 0);
        cVar17 = -(_is_tcp_local->local_ip6[4] == 0);
        cVar18 = -(_is_tcp_local->local_ip6[5] == 0);
        cVar19 = -(_is_tcp_local->local_ip6[6] == 0);
        cVar20 = -(_is_tcp_local->local_ip6[7] == 0);
        cVar21 = -(_is_tcp_local->local_ip6[8] == 0);
        cVar22 = -(_is_tcp_local->local_ip6[9] == 0);
        cVar23 = -(_is_tcp_local->local_ip6[10] == 0);
        cVar24 = -(_is_tcp_local->local_ip6[0xb] == 0);
        cVar25 = -(_is_tcp_local->local_ip6[0xc] == 0);
        cVar26 = -(_is_tcp_local->local_ip6[0xd] == 0);
        cVar27 = -(_is_tcp_local->local_ip6[0xe] == 0);
        bVar28 = -(_is_tcp_local->local_ip6[0xf] == 0);
        auVar2[1] = cVar14;
        auVar2[0] = cVar13;
        auVar2[2] = cVar15;
        auVar2[3] = cVar16;
        auVar2[4] = cVar17;
        auVar2[5] = cVar18;
        auVar2[6] = cVar19;
        auVar2[7] = cVar20;
        auVar2[8] = cVar21;
        auVar2[9] = cVar22;
        auVar2[10] = cVar23;
        auVar2[0xb] = cVar24;
        auVar2[0xc] = cVar25;
        auVar2[0xd] = cVar26;
        auVar2[0xe] = cVar27;
        auVar2[0xf] = bVar28;
        auVar3[1] = cVar14;
        auVar3[0] = cVar13;
        auVar3[2] = cVar15;
        auVar3[3] = cVar16;
        auVar3[4] = cVar17;
        auVar3[5] = cVar18;
        auVar3[6] = cVar19;
        auVar3[7] = cVar20;
        auVar3[8] = cVar21;
        auVar3[9] = cVar22;
        auVar3[10] = cVar23;
        auVar3[0xb] = cVar24;
        auVar3[0xc] = cVar25;
        auVar3[0xd] = cVar26;
        auVar3[0xe] = cVar27;
        auVar3[0xf] = bVar28;
        auVar7[1] = cVar16;
        auVar7[0] = cVar15;
        auVar7[2] = cVar17;
        auVar7[3] = cVar18;
        auVar7[4] = cVar19;
        auVar7[5] = cVar20;
        auVar7[6] = cVar21;
        auVar7[7] = cVar22;
        auVar7[8] = cVar23;
        auVar7[9] = cVar24;
        auVar7[10] = cVar25;
        auVar7[0xb] = cVar26;
        auVar7[0xc] = cVar27;
        auVar7[0xd] = bVar28;
        auVar6[1] = cVar17;
        auVar6[0] = cVar16;
        auVar6[2] = cVar18;
        auVar6[3] = cVar19;
        auVar6[4] = cVar20;
        auVar6[5] = cVar21;
        auVar6[6] = cVar22;
        auVar6[7] = cVar23;
        auVar6[8] = cVar24;
        auVar6[9] = cVar25;
        auVar6[10] = cVar26;
        auVar6[0xb] = cVar27;
        auVar6[0xc] = bVar28;
        auVar5[1] = cVar18;
        auVar5[0] = cVar17;
        auVar5[2] = cVar19;
        auVar5[3] = cVar20;
        auVar5[4] = cVar21;
        auVar5[5] = cVar22;
        auVar5[6] = cVar23;
        auVar5[7] = cVar24;
        auVar5[8] = cVar25;
        auVar5[9] = cVar26;
        auVar5[10] = cVar27;
        auVar5[0xb] = bVar28;
        auVar4[1] = cVar19;
        auVar4[0] = cVar18;
        auVar4[2] = cVar20;
        auVar4[3] = cVar21;
        auVar4[4] = cVar22;
        auVar4[5] = cVar23;
        auVar4[6] = cVar24;
        auVar4[7] = cVar25;
        auVar4[8] = cVar26;
        auVar4[9] = cVar27;
        auVar4[10] = bVar28;
        if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(cVar25
                                                  ,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(cVar22,
                                                  CONCAT12(cVar21,CONCAT11(cVar20,cVar19))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(cVar25
                                                  ,CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(cVar22,
                                                  CONCAT11(cVar21,cVar20)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar28 >> 7) << 0xf) != 0xffff) {
          memset(&rv,0,0x1c);
          rv._0_2_ = 10;
          local._0_8_ = *(undefined8 *)_is_tcp_local->local_ip6;
          local.sa4.sin_zero = (uchar  [8])*(undefined8 *)(_is_tcp_local->local_ip6 + 8);
          bind_flags = 0x1c;
        }
      }
      if ((bind_flags != 0) &&
         ((_is_tcp_local->sock_funcs).abind !=
          (_func_int_ares_socket_t_uint_sockaddr_ptr_socklen_t_void_ptr *)0x0)) {
        local_4c = 2;
        if (local.sa6.sin6_scope_id != 0) {
          local_4c = 3;
        }
        iVar9 = (*(_is_tcp_local->sock_funcs).abind)
                          (local._20_4_,local_4c,(sockaddr *)&rv,bind_flags,
                           _is_tcp_local->sock_func_cb_data);
        if (iVar9 != 0) {
          return ARES_ECONNREFUSED;
        }
      }
      channel_local._4_4_ = ARES_SUCCESS;
    }
    else {
      channel_local._4_4_ = ARES_ECONNREFUSED;
    }
  }
  else {
    channel_local._4_4_ = ARES_ECONNREFUSED;
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_socket_configure(ares_channel_t *channel, int family,
                                    ares_bool_t is_tcp, ares_socket_t fd)
{
  union {
    struct sockaddr     sa;
    struct sockaddr_in  sa4;
    struct sockaddr_in6 sa6;
  } local;

  ares_socklen_t bindlen = 0;
  int            rv;
  unsigned int   bind_flags = 0;

  /* Set the socket's send and receive buffer sizes. */
  if (channel->socket_send_buffer_size > 0) {
    rv = channel->sock_funcs.asetsockopt(
      fd, ARES_SOCKET_OPT_SENDBUF_SIZE,
      (void *)&channel->socket_send_buffer_size,
      sizeof(channel->socket_send_buffer_size), channel->sock_func_cb_data);
    if (rv != 0 && SOCKERRNO != ENOSYS) {
      return ARES_ECONNREFUSED; /* LCOV_EXCL_LINE: UntestablePath */
    }
  }

  if (channel->socket_receive_buffer_size > 0) {
    rv = channel->sock_funcs.asetsockopt(
      fd, ARES_SOCKET_OPT_RECVBUF_SIZE,
      (void *)&channel->socket_receive_buffer_size,
      sizeof(channel->socket_receive_buffer_size), channel->sock_func_cb_data);
    if (rv != 0 && SOCKERRNO != ENOSYS) {
      return ARES_ECONNREFUSED; /* LCOV_EXCL_LINE: UntestablePath */
    }
  }

  /* Bind to network interface if configured */
  if (ares_strlen(channel->local_dev_name)) {
    /* Prior versions silently ignored failure, so we need to maintain that
     * compatibility */
    (void)channel->sock_funcs.asetsockopt(
      fd, ARES_SOCKET_OPT_BIND_DEVICE, channel->local_dev_name,
      (ares_socklen_t)ares_strlen(channel->local_dev_name),
      channel->sock_func_cb_data);
  }

  /* Bind to ip address if configured */
  if (family == AF_INET && channel->local_ip4) {
    memset(&local.sa4, 0, sizeof(local.sa4));
    local.sa4.sin_family      = AF_INET;
    local.sa4.sin_addr.s_addr = htonl(channel->local_ip4);
    bindlen                   = sizeof(local.sa4);
  } else if (family == AF_INET6 &&
             memcmp(channel->local_ip6, ares_in6addr_any._S6_un._S6_u8,
                    sizeof(channel->local_ip6)) != 0) {
    /* Only if not link-local and an ip other than "::" is specified */
    memset(&local.sa6, 0, sizeof(local.sa6));
    local.sa6.sin6_family = AF_INET6;
    memcpy(&local.sa6.sin6_addr, channel->local_ip6,
           sizeof(channel->local_ip6));
    bindlen = sizeof(local.sa6);
  }


  if (bindlen && channel->sock_funcs.abind != NULL) {
    bind_flags |= ARES_SOCKET_BIND_CLIENT;
    if (is_tcp) {
      bind_flags |= ARES_SOCKET_BIND_TCP;
    }
    if (channel->sock_funcs.abind(fd, bind_flags, &local.sa, bindlen,
                                  channel->sock_func_cb_data) != 0) {
      return ARES_ECONNREFUSED;
    }
  }

  return ARES_SUCCESS;
}